

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

size_t __thiscall Assimp::CFIReaderImpl::parseInt3(CFIReaderImpl *this)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  size_t sVar4;
  DeadlyImportError *this_00;
  byte *pbVar5;
  
  pbVar5 = this->dataP;
  pbVar1 = pbVar5 + 1;
  this->dataP = pbVar1;
  bVar2 = *pbVar5;
  uVar3 = (uint)bVar2;
  if ((bVar2 & 0x20) == 0) {
    sVar4 = (size_t)(uVar3 & 0x1f);
  }
  else {
    if ((bVar2 & 0x38) == 0x28) {
      if ((long)this->dataEnd - (long)pbVar1 < 2) goto LAB_00636fb2;
      sVar4 = (size_t)((uint)pbVar5[1] * 0x100 + ((uint)pbVar5[2] | (uVar3 & 7) << 0x10) + 0x820);
      pbVar5 = pbVar5 + 3;
    }
    else {
      if ((bVar2 & 0x38) == 0x20) {
        if (0 < (long)this->dataEnd - (long)pbVar1) {
          this->dataP = pbVar5 + 2;
          return (ulong)((uVar3 & 7) * 0x100 + (uint)pbVar5[1] + 0x20);
        }
LAB_00636fb2:
        this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(this_00,(string *)&parseErrorMessage_abi_cxx11_);
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((((uVar3 & 0x3f) != 0x30) || ((long)this->dataEnd - (long)pbVar1 < 3)) || (0xf < *pbVar1))
      goto LAB_00636fb2;
      sVar4 = (ulong)pbVar5[3] + (ulong)((uint)pbVar5[2] << 8 | (uint)*pbVar1 << 0x10) + 0x80820;
      pbVar5 = pbVar5 + 4;
    }
    this->dataP = pbVar5;
  }
  return sVar4;
}

Assistant:

size_t parseInt3() { // C.27
        uint8_t b = *dataP++;
        if (!(b & 0x20)) { // xx0..... (C.27.2)
            return b & 0x1f;
        }
        else if ((b & 0x38) == 0x20) { // xx100... ........ (C.27.3)
            if (dataEnd - dataP > 0) {
                return (((b & 0x07) << 8) | *dataP++) + 0x20;
            }
        }
        else if ((b & 0x38) == 0x28) { // xx101... ........ ........ (C.27.4)
            if (dataEnd - dataP > 1) {
                size_t result = (((b & 0x07) << 16) | (dataP[0] << 8) | dataP[1]) + 0x820;
                dataP += 2;
                return result;
            }
        }
        else if ((b & 0x3f) == 0x30) { // xx110000 0000.... ........ ........ (C.27.5)
            if ((dataEnd - dataP > 2) && !(dataP[0] & 0xf0)) {
                size_t result = (((dataP[0] & 0x0f) << 16) | (dataP[1] << 8) | dataP[2]) + 0x80820;
                dataP += 3;
                return result;
            }
        }
        throw DeadlyImportError(parseErrorMessage);
    }